

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureMemoryRegistry.cpp
# Opt level: O0

void __thiscall SecureMemoryRegistry::~SecureMemoryRegistry(SecureMemoryRegistry *this)

{
  SecureMemoryRegistry *in_RDI;
  
  ~SecureMemoryRegistry(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

SecureMemoryRegistry::~SecureMemoryRegistry()
{
	if (!registry.empty())
	{
		ERROR_MSG("SecureMemoryRegistry is not empty: leak!");
	}
	MutexFactory::i()->recycleMutex(SecMemRegistryMutex);
}